

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branching.cpp
# Opt level: O3

bool __thiscall PriorityBranchGroup::finished(PriorityBranchGroup *this)

{
  Tint *pTVar1;
  int iVar2;
  ulong uVar3;
  TrailElem local_30;
  
  if ((this->super_BranchGroup).fin.v == 0) {
    pTVar1 = &(this->super_BranchGroup).fin;
    if ((this->annotations).sz == 0) {
      local_30.x = 0;
    }
    else {
      uVar3 = 0;
      do {
        iVar2 = (**(this->annotations).data[uVar3]->_vptr_Branching)();
        if ((char)iVar2 == '\0') {
          return false;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (this->annotations).sz);
      local_30.x = pTVar1->v;
    }
    local_30.sz = 4;
    local_30.pt = &pTVar1->v;
    vec<TrailElem>::push(&engine.trail,&local_30);
    pTVar1->v = 1;
  }
  return true;
}

Assistant:

bool PriorityBranchGroup::finished() {
	if (fin != 0) {
		return true;
	}
	for (unsigned int i = 0; i < annotations.size(); i++) {
		if (!annotations[i]->finished()) {
			return false;
		}
	}
	fin = 1;
	return true;
}